

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Element *e2;
  int iVar12;
  undefined4 in_register_00000034;
  bool bVar13;
  Element local_98;
  long local_50;
  undefined8 local_48;
  long local_40;
  ElementCompare *local_38;
  
  local_48 = CONCAT44(in_register_00000034,end);
  local_50 = (long)start;
  local_40 = 2;
  local_38 = compare;
  do {
    iVar3 = SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::ElementCompare>
            ::incs[local_40];
    lVar1 = iVar3 + local_50;
    lVar11 = lVar1;
    iVar12 = start;
    if ((int)lVar1 <= (int)local_48) {
      do {
        local_98.val.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(keys[lVar11].val.m_backend.data._M_elems + 8);
        local_98.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)keys[lVar11].val.m_backend.data._M_elems;
        local_98.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(keys[lVar11].val.m_backend.data._M_elems + 2);
        puVar2 = keys[lVar11].val.m_backend.data._M_elems + 4;
        local_98.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_98.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_98.val.m_backend.exp = keys[lVar11].val.m_backend.exp;
        local_98.val.m_backend.neg = keys[lVar11].val.m_backend.neg;
        local_98.val.m_backend.fpclass = keys[lVar11].val.m_backend.fpclass;
        local_98.val.m_backend.prec_elem = keys[lVar11].val.m_backend.prec_elem;
        local_98.idx = keys[lVar11].idx;
        iVar10 = (int)lVar11;
        iVar4 = iVar12;
        if (lVar1 <= lVar11) {
          do {
            e2 = keys + iVar4;
            iVar9 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::ElementCompare::operator()(local_38,&local_98,e2);
            iVar10 = iVar4;
            if (-1 < iVar9) break;
            iVar10 = iVar3 + iVar4;
            *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 8) =
                 *(undefined8 *)((e2->val).m_backend.data._M_elems + 8);
            uVar5 = *(undefined8 *)(e2->val).m_backend.data._M_elems;
            uVar6 = *(undefined8 *)((e2->val).m_backend.data._M_elems + 2);
            uVar7 = *(undefined8 *)((e2->val).m_backend.data._M_elems + 6);
            puVar2 = keys[iVar10].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar2 = *(undefined8 *)((e2->val).m_backend.data._M_elems + 4);
            *(undefined8 *)(puVar2 + 2) = uVar7;
            *(undefined8 *)keys[iVar10].val.m_backend.data._M_elems = uVar5;
            *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 2) = uVar6;
            keys[iVar10].val.m_backend.exp = (e2->val).m_backend.exp;
            keys[iVar10].val.m_backend.neg = (e2->val).m_backend.neg;
            iVar8 = (e2->val).m_backend.prec_elem;
            keys[iVar10].val.m_backend.fpclass = (e2->val).m_backend.fpclass;
            keys[iVar10].val.m_backend.prec_elem = iVar8;
            keys[iVar10].idx = e2->idx;
            iVar10 = iVar4 - iVar3;
            bVar13 = (int)lVar1 <= iVar4;
            iVar4 = iVar10;
          } while (bVar13);
          iVar10 = iVar10 + iVar3;
        }
        *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 8) =
             local_98.val.m_backend.data._M_elems._32_8_;
        puVar2 = keys[iVar10].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_98.val.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_98.val.m_backend.data._M_elems._24_8_;
        *(undefined8 *)keys[iVar10].val.m_backend.data._M_elems =
             local_98.val.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(keys[iVar10].val.m_backend.data._M_elems + 2) =
             local_98.val.m_backend.data._M_elems._8_8_;
        keys[iVar10].val.m_backend.exp = local_98.val.m_backend.exp;
        keys[iVar10].val.m_backend.neg = local_98.val.m_backend.neg;
        keys[iVar10].val.m_backend.fpclass = local_98.val.m_backend.fpclass;
        keys[iVar10].val.m_backend.prec_elem = local_98.val.m_backend.prec_elem;
        keys[iVar10].idx = local_98.idx;
        lVar11 = lVar11 + 1;
        iVar12 = iVar12 + 1;
      } while (end + 1 != (int)lVar11);
    }
    bVar13 = local_40 == 0;
    local_40 = local_40 + -1;
    if (bVar13) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}